

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpCrashHandler.c
# Opt level: O1

void signalHandler(int sigNum)

{
  qpCrashHandler *pqVar1;
  long lVar2;
  char *pcVar3;
  qpCrashType qVar4;
  long lVar5;
  
  pqVar1 = g_crashHandler;
  lVar2 = 0;
  lVar5 = 0;
  do {
    if (*(int *)((long)&s_signals[0].signalNum + lVar5) == sigNum) {
      lVar2 = (long)&s_signals[0].signalNum + lVar5;
      break;
    }
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x60);
  if (lVar2 == 0) {
    qVar4 = QP_CRASHTYPE_OTHER;
    pcVar3 = "Unknown signal";
  }
  else {
    qVar4 = *(qpCrashType *)(lVar2 + 4);
    pcVar3 = *(char **)(lVar2 + 8);
  }
  (g_crashHandler->crashInfo).type = qVar4;
  (pqVar1->crashInfo).message = pcVar3;
  (pqVar1->crashInfo).file = (char *)0x0;
  (pqVar1->crashInfo).line = 0;
  if (pqVar1->crashHandlerFunc != (qpCrashHandlerFunc)0x0) {
    (*pqVar1->crashHandlerFunc)(pqVar1,pqVar1->handlerUserPointer);
    return;
  }
  return;
}

Assistant:

static void signalHandler (int sigNum)
{
	const SignalInfo*	info	= getSignalInfo(sigNum);
	qpCrashType			type	= info ? info->type : QP_CRASHTYPE_OTHER;
	const char*			name	= info ? info->name : "Unknown signal";

	qpCrashInfo_set(&g_crashHandler->crashInfo, type, name, DE_NULL, 0);

	if (g_crashHandler->crashHandlerFunc != DE_NULL)
		g_crashHandler->crashHandlerFunc(g_crashHandler, g_crashHandler->handlerUserPointer);
}